

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void prepare_vertical_filter_coeffs_delta0_avx2(int gamma,int sy,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  WarpedFilterCoeff aWVar19 [8];
  WarpedFilterCoeff aWVar20 [8];
  int iVar21;
  int iVar22;
  int iVar23;
  WarpedFilterCoeff (*paWVar24) [8];
  WarpedFilterCoeff (*paWVar25) [8];
  WarpedFilterCoeff (*paWVar26) [8];
  WarpedFilterCoeff (*paWVar27) [8];
  undefined1 (*in_RDX) [32];
  int in_ESI;
  int in_EDI;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  __m256i filt_3;
  __m256i filt_2;
  __m256i filt_1;
  __m256i filt_0;
  __m128i filt_03;
  __m128i filt_02;
  __m128i filt_01;
  __m128i filt_00;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  paWVar24 = av1_warped_filter + (in_ESI >> 10);
  iVar21 = in_ESI + in_EDI * 2 >> 10;
  paWVar25 = av1_warped_filter + iVar21;
  iVar22 = in_ESI + in_EDI * 4 >> 10;
  paWVar26 = av1_warped_filter + iVar22;
  iVar23 = in_ESI + in_EDI * 6 >> 10;
  paWVar27 = av1_warped_filter + iVar23;
  uVar6 = *(undefined8 *)*paWVar27;
  uVar7 = *(undefined8 *)(av1_warped_filter[iVar23] + 4);
  aWVar20 = *paWVar27;
  aWVar19 = *paWVar27;
  auVar10._8_8_ = uStack_28;
  auVar10._0_8_ = uStack_30;
  auVar10._16_8_ = uStack_30;
  auVar10._24_8_ = uStack_28;
  auVar9._16_8_ = *(undefined8 *)*paWVar24;
  auVar9._0_16_ = (undefined1  [16])*paWVar24;
  auVar9._24_8_ = *(undefined8 *)(av1_warped_filter[in_ESI >> 10] + 4);
  auVar3 = vpunpckldq_avx2(auVar10,auVar9);
  auVar8._16_8_ = *(undefined8 *)*paWVar25;
  auVar8._0_16_ = (undefined1  [16])*paWVar25;
  auVar8._24_8_ = *(undefined8 *)(av1_warped_filter[iVar21] + 4);
  auVar5._16_8_ = *(undefined8 *)*paWVar26;
  auVar5._0_16_ = (undefined1  [16])*paWVar26;
  auVar5._24_8_ = *(undefined8 *)(av1_warped_filter[iVar22] + 4);
  auVar4 = vpunpckldq_avx2(auVar8,auVar5);
  auVar18._8_8_ = uStack_28;
  auVar18._0_8_ = uStack_30;
  auVar18._16_8_ = uStack_30;
  auVar18._24_8_ = uStack_28;
  auVar17._16_8_ = *(undefined8 *)*paWVar24;
  auVar17._0_16_ = (undefined1  [16])*paWVar24;
  auVar17._24_8_ = *(undefined8 *)(av1_warped_filter[in_ESI >> 10] + 4);
  auVar1 = vpunpckhdq_avx2(auVar18,auVar17);
  auVar16._16_8_ = *(undefined8 *)*paWVar25;
  auVar16._0_16_ = (undefined1  [16])*paWVar25;
  auVar16._24_8_ = *(undefined8 *)(av1_warped_filter[iVar21] + 4);
  auVar15._16_8_ = *(undefined8 *)*paWVar26;
  auVar15._0_16_ = (undefined1  [16])*paWVar26;
  auVar15._24_8_ = *(undefined8 *)(av1_warped_filter[iVar22] + 4);
  auVar2 = vpunpckhdq_avx2(auVar16,auVar15);
  auVar5 = vpunpcklqdq_avx2(auVar3,auVar4);
  *in_RDX = auVar5;
  auVar3 = vpunpckhqdq_avx2(auVar3,auVar4);
  in_RDX[1] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
  in_RDX[2] = auVar3;
  auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
  in_RDX[3] = auVar1;
  iVar21 = in_ESI + in_EDI >> 10;
  paWVar24 = av1_warped_filter + iVar21;
  iVar22 = in_ESI + in_EDI * 3 >> 10;
  paWVar25 = av1_warped_filter + iVar22;
  iVar23 = in_ESI + in_EDI * 5 >> 10;
  paWVar26 = av1_warped_filter + iVar23;
  auVar4._16_8_ = uVar6;
  auVar4._0_16_ = (undefined1  [16])aWVar19;
  auVar4._24_8_ = uVar7;
  auVar3._16_8_ = *(undefined8 *)*paWVar24;
  auVar3._0_16_ = (undefined1  [16])*paWVar24;
  auVar3._24_8_ = *(undefined8 *)(av1_warped_filter[iVar21] + 4);
  auVar3 = vpunpckldq_avx2(auVar4,auVar3);
  auVar2._16_8_ = *(undefined8 *)*paWVar25;
  auVar2._0_16_ = (undefined1  [16])*paWVar25;
  auVar2._24_8_ = *(undefined8 *)(av1_warped_filter[iVar22] + 4);
  auVar1._16_8_ = *(undefined8 *)*paWVar26;
  auVar1._0_16_ = (undefined1  [16])*paWVar26;
  auVar1._24_8_ = *(undefined8 *)(av1_warped_filter[iVar23] + 4);
  auVar4 = vpunpckldq_avx2(auVar2,auVar1);
  auVar14._16_8_ = uVar6;
  auVar14._0_16_ = (undefined1  [16])aWVar20;
  auVar14._24_8_ = uVar7;
  auVar13._16_8_ = *(undefined8 *)*paWVar24;
  auVar13._0_16_ = (undefined1  [16])*paWVar24;
  auVar13._24_8_ = *(undefined8 *)(av1_warped_filter[iVar21] + 4);
  auVar1 = vpunpckhdq_avx2(auVar14,auVar13);
  auVar12._16_8_ = *(undefined8 *)*paWVar25;
  auVar12._0_16_ = (undefined1  [16])*paWVar25;
  auVar12._24_8_ = *(undefined8 *)(av1_warped_filter[iVar22] + 4);
  auVar11._16_8_ = *(undefined8 *)*paWVar26;
  auVar11._0_16_ = (undefined1  [16])*paWVar26;
  auVar11._24_8_ = *(undefined8 *)(av1_warped_filter[iVar23] + 4);
  auVar2 = vpunpckhdq_avx2(auVar12,auVar11);
  auVar5 = vpunpcklqdq_avx2(auVar3,auVar4);
  in_RDX[4] = auVar5;
  auVar3 = vpunpckhqdq_avx2(auVar3,auVar4);
  in_RDX[5] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
  in_RDX[6] = auVar3;
  auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
  in_RDX[7] = auVar1;
  return;
}

Assistant:

static inline void prepare_vertical_filter_coeffs_delta0_avx2(int gamma, int sy,
                                                              __m256i *coeffs) {
  __m128i filt_00 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_01 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_02 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
  __m128i filt_03 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

  __m256i filt_0 = _mm256_broadcastsi128_si256(filt_00);
  __m256i filt_1 = _mm256_broadcastsi128_si256(filt_01);
  __m256i filt_2 = _mm256_broadcastsi128_si256(filt_02);
  __m256i filt_3 = _mm256_broadcastsi128_si256(filt_03);

  __m256i res_0 = _mm256_unpacklo_epi32(filt_0, filt_1);
  __m256i res_1 = _mm256_unpacklo_epi32(filt_2, filt_3);
  __m256i res_2 = _mm256_unpackhi_epi32(filt_0, filt_1);
  __m256i res_3 = _mm256_unpackhi_epi32(filt_2, filt_3);

  coeffs[0] = _mm256_unpacklo_epi64(res_0, res_1);
  coeffs[1] = _mm256_unpackhi_epi64(res_0, res_1);
  coeffs[2] = _mm256_unpacklo_epi64(res_2, res_3);
  coeffs[3] = _mm256_unpackhi_epi64(res_2, res_3);

  filt_00 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_01 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_02 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
  filt_03 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sy + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

  filt_0 = _mm256_broadcastsi128_si256(filt_00);
  filt_1 = _mm256_broadcastsi128_si256(filt_01);
  filt_2 = _mm256_broadcastsi128_si256(filt_02);
  filt_3 = _mm256_broadcastsi128_si256(filt_03);

  res_0 = _mm256_unpacklo_epi32(filt_0, filt_1);
  res_1 = _mm256_unpacklo_epi32(filt_2, filt_3);
  res_2 = _mm256_unpackhi_epi32(filt_0, filt_1);
  res_3 = _mm256_unpackhi_epi32(filt_2, filt_3);

  coeffs[4] = _mm256_unpacklo_epi64(res_0, res_1);
  coeffs[5] = _mm256_unpackhi_epi64(res_0, res_1);
  coeffs[6] = _mm256_unpacklo_epi64(res_2, res_3);
  coeffs[7] = _mm256_unpackhi_epi64(res_2, res_3);
}